

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

CURLcode Curl_ws_accept(Curl_easy *data,char *mem,size_t nread)

{
  CURLcode CVar1;
  ssize_t sVar2;
  ssize_t nwritten;
  size_t chunk_size;
  Curl_cwriter *pCStack_40;
  CURLcode result;
  Curl_cwriter *ws_dec_writer;
  websocket *ws;
  SingleRequest *k;
  size_t nread_local;
  char *mem_local;
  Curl_easy *data_local;
  
  ws = (websocket *)&data->req;
  k = (SingleRequest *)nread;
  nread_local = (size_t)mem;
  mem_local = (char *)data;
  ws_dec_writer = (Curl_cwriter *)Curl_conn_meta_get(data->conn,"meta:proto:ws:conn");
  if (ws_dec_writer == (Curl_cwriter *)0x0) {
    ws_dec_writer = (Curl_cwriter *)(*Curl_ccalloc)(1,0x108);
    if (ws_dec_writer == (Curl_cwriter *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if ((((mem_local != (char *)0x0) && ((*(ulong *)(mem_local + 0xa2c) >> 0x1e & 1) != 0)) &&
        ((*(long *)(mem_local + 0x1310) == 0 || (0 < *(int *)(*(long *)(mem_local + 0x1310) + 8)))))
       && (0 < Curl_trc_feat_ws.log_level)) {
      Curl_trc_ws((Curl_easy *)mem_local,"WS, using chunk size %zu",0xffff);
    }
    Curl_bufq_init2((bufq *)(ws_dec_writer + 3),0xffff,2,1);
    Curl_bufq_init2((bufq *)(ws_dec_writer + 5),0xffff,2,1);
    ws_dec_init((ws_decoder *)&ws_dec_writer->next);
    ws_enc_init((ws_encoder *)(ws_dec_writer + 2));
    CVar1 = Curl_conn_meta_set(*(connectdata **)(mem_local + 0x20),"meta:proto:ws:conn",
                               ws_dec_writer,ws_conn_dtor);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    chunk_size._4_4_ = 0;
  }
  else {
    Curl_bufq_reset((bufq *)(ws_dec_writer + 3));
    ws_dec_reset((ws_decoder *)&ws_dec_writer->next);
    ws_enc_reset((ws_encoder *)(ws_dec_writer + 2));
  }
  chunk_size._4_4_ =
       Curl_rand_bytes((Curl_easy *)mem_local,(uchar *)((long)&ws_dec_writer[2].ctx + 4),4);
  data_local._4_4_ = chunk_size._4_4_;
  if (chunk_size._4_4_ == CURLE_OK) {
    if (((mem_local != (char *)0x0) && ((*(ulong *)(mem_local + 0xa2c) >> 0x1e & 1) != 0)) &&
       ((*(long *)(mem_local + 0x1310) == 0 || (0 < *(int *)(*(long *)(mem_local + 0x1310) + 8)))))
    {
      Curl_infof((Curl_easy *)mem_local,"Received 101, switch to WebSocket; mask %02x%02x%02x%02x",
                 (ulong)*(byte *)((long)&ws_dec_writer[2].ctx + 4),
                 (ulong)*(byte *)((long)&ws_dec_writer[2].ctx + 5),
                 (ulong)*(byte *)((long)&ws_dec_writer[2].ctx + 6),
                 (ulong)*(byte *)((long)&ws_dec_writer[2].ctx + 7));
    }
    chunk_size._4_4_ =
         Curl_cwriter_create(&stack0xffffffffffffffc0,(Curl_easy *)mem_local,&ws_cw_decode,
                             CURL_CW_CONTENT_DECODE);
    data_local._4_4_ = chunk_size._4_4_;
    if (chunk_size._4_4_ == CURLE_OK) {
      chunk_size._4_4_ = Curl_cwriter_add((Curl_easy *)mem_local,pCStack_40);
      if (chunk_size._4_4_ == CURLE_OK) {
        if ((*(ulong *)(mem_local + 0xa2c) & 1) == 0) {
          if (k != (SingleRequest *)0x0) {
            chunk_size._4_4_ =
                 Curl_client_write((Curl_easy *)mem_local,1,(char *)nread_local,(size_t)k);
          }
        }
        else {
          sVar2 = Curl_bufq_write((bufq *)(ws_dec_writer + 3),(uchar *)nread_local,(size_t)k,
                                  (CURLcode *)((long)&chunk_size + 4));
          if (sVar2 < 0) {
            return chunk_size._4_4_;
          }
          if (((mem_local != (char *)0x0) && ((*(ulong *)(mem_local + 0xa2c) >> 0x1e & 1) != 0)) &&
             ((*(long *)(mem_local + 0x1310) == 0 ||
              (0 < *(int *)(*(long *)(mem_local + 0x1310) + 8))))) {
            Curl_infof((Curl_easy *)mem_local,"%zu bytes websocket payload",k);
          }
        }
        (ws->enc).mask[0] = '\x03';
        (ws->enc).mask[1] = '\0';
        (ws->enc).mask[2] = '\0';
        (ws->enc).mask[3] = '\0';
        data_local._4_4_ = chunk_size._4_4_;
      }
      else {
        Curl_cwriter_free((Curl_easy *)mem_local,pCStack_40);
        data_local._4_4_ = chunk_size._4_4_;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_ws_accept(struct Curl_easy *data,
                        const char *mem, size_t nread)
{
  struct SingleRequest *k = &data->req;
  struct websocket *ws;
  struct Curl_cwriter *ws_dec_writer;
  CURLcode result;

  DEBUGASSERT(data->conn);
  ws = Curl_conn_meta_get(data->conn, CURL_META_PROTO_WS_CONN);
  if(!ws) {
    size_t chunk_size = WS_CHUNK_SIZE;
    ws = calloc(1, sizeof(*ws));
    if(!ws)
      return CURLE_OUT_OF_MEMORY;
#ifdef DEBUGBUILD
    {
      const char *p = getenv("CURL_WS_CHUNK_SIZE");
      if(p) {
        curl_off_t l;
        if(!Curl_str_number(&p, &l, 1*1024*1024))
          chunk_size = (size_t)l;
      }
    }
#endif
    CURL_TRC_WS(data, "WS, using chunk size %zu", chunk_size);
    Curl_bufq_init2(&ws->recvbuf, chunk_size, WS_CHUNK_COUNT,
                    BUFQ_OPT_SOFT_LIMIT);
    Curl_bufq_init2(&ws->sendbuf, chunk_size, WS_CHUNK_COUNT,
                    BUFQ_OPT_SOFT_LIMIT);
    ws_dec_init(&ws->dec);
    ws_enc_init(&ws->enc);
    result = Curl_conn_meta_set(data->conn, CURL_META_PROTO_WS_CONN,
                                ws, ws_conn_dtor);
    if(result)
      return result;
  }
  else {
    Curl_bufq_reset(&ws->recvbuf);
    ws_dec_reset(&ws->dec);
    ws_enc_reset(&ws->enc);
  }
  /* Verify the Sec-WebSocket-Accept response.

     The sent value is the base64 encoded version of a SHA-1 hash done on the
     |Sec-WebSocket-Key| header field concatenated with
     the string "258EAFA5-E914-47DA-95CA-C5AB0DC85B11".
  */

  /* If the response includes a |Sec-WebSocket-Extensions| header field and
     this header field indicates the use of an extension that was not present
     in the client's handshake (the server has indicated an extension not
     requested by the client), the client MUST Fail the WebSocket Connection.
  */

  /* If the response includes a |Sec-WebSocket-Protocol| header field
     and this header field indicates the use of a subprotocol that was
     not present in the client's handshake (the server has indicated a
     subprotocol not requested by the client), the client MUST Fail
     the WebSocket Connection. */

  /* 4 bytes random */

  result = Curl_rand(data, (unsigned char *)&ws->enc.mask,
                     sizeof(ws->enc.mask));
  if(result)
    return result;
  infof(data, "Received 101, switch to WebSocket; mask %02x%02x%02x%02x",
        ws->enc.mask[0], ws->enc.mask[1], ws->enc.mask[2], ws->enc.mask[3]);

  /* Install our client writer that decodes WS frames payload */
  result = Curl_cwriter_create(&ws_dec_writer, data, &ws_cw_decode,
                               CURL_CW_CONTENT_DECODE);
  if(result)
    return result;

  result = Curl_cwriter_add(data, ws_dec_writer);
  if(result) {
    Curl_cwriter_free(data, ws_dec_writer);
    return result;
  }

  if(data->set.connect_only) {
    ssize_t nwritten;
    /* In CONNECT_ONLY setup, the payloads from `mem` need to be received
     * when using `curl_ws_recv` later on after this transfer is already
     * marked as DONE. */
    nwritten = Curl_bufq_write(&ws->recvbuf, (const unsigned char *)mem,
                               nread, &result);
    if(nwritten < 0)
      return result;
    infof(data, "%zu bytes websocket payload", nread);
  }
  else { /* !connect_only */
    /* And pass any additional data to the writers */
    if(nread) {
      result = Curl_client_write(data, CLIENTWRITE_BODY, mem, nread);
    }
  }
  k->upgr101 = UPGR101_RECEIVED;

  return result;
}